

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_StopSound(FPolyObj *poly,int channel)

{
  FSoundChan *pFVar1;
  FSoundChan *next;
  FSoundChan *chan;
  int channel_local;
  FPolyObj *poly_local;
  
  next = Channels;
  pFVar1 = next;
  while (next = pFVar1, next != (FSoundChan *)0x0) {
    pFVar1 = next->NextChan;
    if (((next->SourceType == '\x03') && ((next->field_12).Actor == (AActor *)poly)) &&
       (((uint)next->EntChannel == channel || ((i_compatflags & 0x20U) != 0)))) {
      S_StopChannel(next);
    }
  }
  return;
}

Assistant:

void S_StopSound (const FPolyObj *poly, int channel)
{
	FSoundChan *chan = Channels;
	while (chan != NULL)
	{
		FSoundChan *next = chan->NextChan;
		if (chan->SourceType == SOURCE_Polyobj &&
			chan->Poly == poly &&
			(chan->EntChannel == channel || (i_compatflags & COMPATF_MAGICSILENCE)))
		{
			S_StopChannel(chan);
		}
		chan = next;
	}
}